

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_d715c4::Scenario::ForgetTxHash(Scenario *this,uint256 *txhash)

{
  long lVar1;
  undefined8 *in_RSI;
  anon_class_40_2_8cb482fb *in_RDI;
  long in_FS_OFFSET;
  Runner *runner;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
  ::
  emplace_back<std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::ForgetTxHash(uint256_const&)::_lambda()_1_>
            ((vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              *)*in_RSI,
             *(duration<long,_std::ratio<1L,_1000000L>_> **)
              (in_RDI->txhash).super_base_blob<256U>.m_data._M_elems,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ForgetTxHash(const uint256& txhash)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ForgetTxHash(txhash);
            runner.txrequest.SanityCheck();
        });
    }